

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# satSolver.c
# Opt level: O1

int sat_solver_solve_internal(sat_solver *s)

{
  ABC_INT64_T *pAVar1;
  float fVar2;
  double *pdVar3;
  word *pwVar4;
  lit *plVar5;
  char *pcVar6;
  double dVar7;
  __time_t _Var8;
  char cVar9;
  int iVar10;
  int iVar11;
  int iVar12;
  int *orderpos;
  timespec *ptVar13;
  word wVar14;
  int *piVar15;
  int *piVar16;
  uint uVar17;
  float *activity;
  ulong uVar18;
  long lVar19;
  uint *puVar20;
  ulong uVar21;
  int iVar22;
  uint uVar23;
  ulong uVar24;
  long lVar25;
  timespec *__tp;
  ulong uVar26;
  timespec *ptVar27;
  ulong uVar28;
  uint uVar29;
  int iVar30;
  bool bVar31;
  float fVar32;
  double dVar33;
  timespec ts;
  uint local_c4;
  ulong local_a0;
  uint local_94;
  timespec local_80;
  ulong local_70;
  int local_68;
  int local_64;
  double local_60;
  long local_58;
  long local_50;
  int *local_48;
  long local_40;
  ulong local_38;
  
  if ((s->unit_lits).size < 0) {
LAB_005493a0:
    __assert_fail("k <= v->size",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/bsat/satVec.h"
                  ,0x30,"void veci_resize(veci *, int)");
  }
  (s->unit_lits).size = 0;
  s->nCalls = s->nCalls + 1;
  if (0 < s->verbosity) {
    puts("==================================[MINISAT]===================================");
    puts("| Conflicts |     ORIGINAL     |              LEARNT              | Progress |");
    puts("|           | Clauses Literals |   Limit Clauses Literals  Lit/Cl |          |");
    puts("==============================================================================");
  }
  local_48 = &s->root_level;
  local_94 = 0;
  cVar9 = '\0';
  do {
    if (cVar9 != '\0') break;
    uVar17 = (s->stats).learnts;
    if (uVar17 == 0) {
      dVar33 = 0.0;
    }
    else {
      dVar33 = (double)(s->stats).learnts_literals / (double)uVar17;
    }
    if (s->nRuntimeLimit == 0) {
LAB_0054731c:
      if (0 < s->verbosity) {
        printf("| %9.0f | %7.0f %8.0f | %7.0f %7.0f %8.0f %7.1f | %6.3f %% |\n",
               SUB84((double)(s->stats).conflicts,0),(double)(s->stats).clauses,
               (double)(s->stats).clauses_literals,0,(double)(s->stats).learnts,
               (double)(s->stats).learnts_literals,dVar33,s->progress_estimate * 100.0);
        fflush(_stdout);
      }
      __tp = (timespec *)(ulong)local_94;
      if ((int)local_94 < 1) {
        uVar17 = 0;
        iVar10 = 0;
      }
      else {
        iVar12 = 1;
        iVar10 = 0;
        do {
          iVar10 = iVar10 + 1;
          uVar17 = iVar12 * 2;
          iVar12 = iVar12 * 2 + 1;
        } while ((int)uVar17 < (int)local_94);
      }
      ptVar13 = __tp;
      if (uVar17 != local_94) {
        do {
          iVar10 = iVar10 + -1;
          uVar18 = (long)(int)ptVar13 % (long)((int)uVar17 >> 1);
          ptVar13 = (timespec *)(uVar18 & 0xffffffff);
          uVar17 = ((int)uVar17 >> 1) - 1;
        } while (uVar17 != (uint)uVar18);
      }
      dVar33 = ldexp(1.0,iVar10);
      if (s->root_level != (s->trail_lim).size) {
        __assert_fail("s->root_level == sat_solver_dl(s)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/bsat/satSolver.c"
                      ,0x720,"lbool sat_solver_search(sat_solver *, ABC_INT64_T)");
      }
      iVar10 = s->fNotUseRandom;
      uVar17 = s->nRestarts;
      s->nRestarts = uVar17 + 1;
      (s->stats).starts = (s->stats).starts + 1;
      ptVar13 = (timespec *)malloc(0x10);
      if (((uVar17 & 1) == 0) && (0 < (s->act_vars).size)) {
        lVar19 = 0;
        do {
          pdVar3 = s->factors;
          if (pdVar3 != (double *)0x0) {
            iVar12 = (s->act_vars).ptr[lVar19];
            iVar11 = s->VarActType;
            if (iVar11 == 2) {
              dVar7 = pdVar3[iVar12];
              if (dVar7 < 1.0) {
                __assert_fail("a >= 1.0",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/util/utilDouble.h"
                              ,0x41,"xdbl Xdbl_FromDouble(double)");
              }
              uVar18 = ((ulong)dVar7 >> 0x34) - 0x3ff;
              if (0xffff < uVar18) goto LAB_005493de;
              uVar21 = s->var_inc;
              uVar28 = s->activity[iVar12];
              uVar24 = uVar18 << 0x30 | (ulong)dVar7 >> 5 & 0x7fffffffffff | 0x800000000000;
              uVar18 = uVar24;
              if (uVar24 < uVar21) {
                uVar18 = uVar21;
              }
              if (uVar21 < uVar24) {
                uVar24 = uVar21;
              }
              uVar21 = uVar18 >> 0x20 & 0xffff;
              uVar26 = uVar24 >> 0x20 & 0xffff;
              uVar21 = (uVar21 * (uVar24 & 0xffffffff) >> 0xf) +
                       (uVar26 * (uVar18 & 0xffffffff) >> 0xf) +
                       ((uVar18 & 0xffffffff) * (uVar24 & 0xffffffff) >> 0x2f |
                       uVar21 * uVar26 * 0x20000);
              uVar26 = uVar21 >> (0xffffffffffff < uVar21);
              uVar21 = (ulong)(0xffffffffffff < uVar21) + (uVar24 >> 0x30) + (uVar18 >> 0x30);
              uVar18 = 0xffffffffffffffff;
              if (uVar21 < 0x10000) {
                if ((uVar26 & 0xffff800000000000) != 0x800000000000) goto LAB_005493de;
                uVar18 = uVar21 << 0x30 | uVar26;
              }
              uVar21 = uVar18;
              if (uVar18 < uVar28) {
                uVar21 = uVar28;
              }
              if (uVar28 < uVar18) {
                uVar18 = uVar28;
              }
              uVar18 = ((uVar18 & 0xffffffffffff) >>
                       ((char)(uVar21 >> 0x30) - (char)(uVar18 >> 0x30) & 0x3fU)) +
                       (uVar21 & 0xffffffffffff);
              __tp = (timespec *)((uVar21 >> 0x30) + (ulong)(0xffffffffffff < uVar18));
              uVar18 = uVar18 >> (0xffffffffffff < uVar18);
              ptVar27 = (timespec *)0xffffffffffffffff;
              if (__tp < (timespec *)0x10000) {
                if ((uVar18 & 0x1800000000000) != 0x800000000000) goto LAB_005493de;
                __tp = (timespec *)((long)__tp << 0x30 | uVar18);
                ptVar27 = __tp;
              }
              s->activity[iVar12] = (word)ptVar27;
              if ((timespec *)0x14c924d692ca61b < ptVar27) {
                act_var_rescale(s);
              }
              piVar16 = s->orderpos;
              uVar17 = piVar16[iVar12];
              uVar18 = (ulong)(int)uVar17;
              if (uVar18 != 0xffffffffffffffff) {
                piVar15 = (s->order).ptr;
                __tp = (timespec *)(ulong)(uint)piVar15[uVar18];
                if (uVar17 != 0) {
                  pwVar4 = s->activity;
                  uVar21 = pwVar4[piVar15[uVar18]];
                  do {
                    uVar23 = (uint)uVar18;
                    uVar29 = (int)((uVar23 - ((int)(uVar23 - 1) >> 0x1f)) + -1) >> 1;
                    iVar12 = piVar15[(int)uVar29];
                    uVar17 = uVar23;
                    if (uVar21 <= pwVar4[iVar12]) break;
                    piVar15[(int)uVar23] = iVar12;
                    piVar16[iVar12] = uVar23;
                    uVar18 = (ulong)uVar29;
                    uVar17 = uVar29;
                  } while (2 < uVar23);
                }
                goto LAB_0054780a;
              }
            }
            else if (iVar11 == 1) {
              dVar7 = (double)s->var_inc * pdVar3[iVar12] + (double)s->activity[iVar12];
              s->activity[iVar12] = (word)dVar7;
              if (1e+100 < dVar7) {
                act_var_rescale(s);
              }
              piVar16 = s->orderpos;
              uVar17 = piVar16[iVar12];
              uVar18 = (ulong)(int)uVar17;
              if (uVar18 != 0xffffffffffffffff) {
                piVar15 = (s->order).ptr;
                __tp = (timespec *)(ulong)(uint)piVar15[uVar18];
                if (uVar17 != 0) {
                  pwVar4 = s->activity;
                  uVar21 = pwVar4[piVar15[uVar18]];
                  do {
                    uVar23 = (uint)uVar18;
                    uVar29 = (int)((uVar23 - ((int)(uVar23 - 1) >> 0x1f)) + -1) >> 1;
                    iVar12 = piVar15[(int)uVar29];
                    uVar17 = uVar23;
                    if (uVar21 <= pwVar4[iVar12]) break;
                    piVar15[(int)uVar23] = iVar12;
                    piVar16[iVar12] = uVar23;
                    uVar18 = (ulong)uVar29;
                    uVar17 = uVar29;
                  } while (2 < uVar23);
                }
                goto LAB_0054780a;
              }
            }
            else {
              if (iVar11 != 0) {
                __assert_fail("0",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/bsat/satSolver.c"
                              ,0x195,"void act_var_bump_factor(sat_solver *, int)");
              }
              wVar14 = (long)(int)((float)pdVar3[iVar12] * (float)(uint)s->var_inc) +
                       s->activity[iVar12];
              s->activity[iVar12] = wVar14;
              if ((int)wVar14 < 0) {
                act_var_rescale(s);
              }
              piVar16 = s->orderpos;
              uVar17 = piVar16[iVar12];
              uVar18 = (ulong)(int)uVar17;
              if (uVar18 != 0xffffffffffffffff) {
                piVar15 = (s->order).ptr;
                __tp = (timespec *)(ulong)(uint)piVar15[uVar18];
                if (uVar17 != 0) {
                  pwVar4 = s->activity;
                  uVar21 = pwVar4[piVar15[uVar18]];
                  do {
                    uVar23 = (uint)uVar18;
                    uVar29 = (int)((uVar23 - ((int)(uVar23 - 1) >> 0x1f)) + -1) >> 1;
                    iVar12 = piVar15[(int)uVar29];
                    uVar17 = uVar23;
                    if (uVar21 <= pwVar4[iVar12]) break;
                    piVar15[(int)uVar23] = iVar12;
                    piVar16[iVar12] = uVar23;
                    uVar18 = (ulong)uVar29;
                    uVar17 = uVar29;
                  } while (2 < uVar23);
                }
LAB_0054780a:
                piVar15[(int)uVar17] = (int)__tp;
                piVar16[(int)__tp] = uVar17;
              }
            }
          }
          lVar19 = lVar19 + 1;
        } while (lVar19 < (s->act_vars).size);
      }
      if ((s->pGlobalVars != (int *)0x0) && (0 < (s->act_vars).size)) {
        lVar19 = 0;
        do {
          if ((s->pGlobalVars != (int *)0x0) &&
             (iVar12 = (s->act_vars).ptr[lVar19], s->pGlobalVars[iVar12] != 0)) {
            iVar11 = s->VarActType;
            if (iVar11 == 2) {
              uVar18 = s->var_inc;
              uVar21 = 0x1c00000000000;
              if (uVar18 < 0x1c00000000000) {
                uVar21 = uVar18;
              }
              if (uVar18 < 0x1c00000000001) {
                uVar18 = 0x1c00000000000;
              }
              uVar28 = s->activity[iVar12];
              uVar24 = uVar18 >> 0x20 & 0xffff;
              uVar26 = uVar21 >> 0x20 & 0xffff;
              uVar24 = (uVar24 * (uVar21 & 0xffffffff) >> 0xf) +
                       (uVar26 * (uVar18 & 0xffffffff) >> 0xf) +
                       ((uVar18 & 0xffffffff) * (uVar21 & 0xffffffff) >> 0x2f |
                       uVar24 * uVar26 * 0x20000);
              uVar26 = uVar24 >> (0xffffffffffff < uVar24);
              uVar21 = (ulong)(0xffffffffffff < uVar24) + (uVar21 >> 0x30) + (uVar18 >> 0x30);
              uVar18 = 0xffffffffffffffff;
              if (uVar21 < 0x10000) {
                if ((uVar26 & 0xffff800000000000) != 0x800000000000) goto LAB_005493de;
                uVar18 = uVar21 << 0x30 | uVar26;
              }
              uVar21 = uVar18;
              if (uVar18 < uVar28) {
                uVar21 = uVar28;
              }
              if (uVar28 < uVar18) {
                uVar18 = uVar28;
              }
              uVar18 = ((uVar18 & 0xffffffffffff) >>
                       ((char)(uVar21 >> 0x30) - (char)(uVar18 >> 0x30) & 0x3fU)) +
                       (uVar21 & 0xffffffffffff);
              __tp = (timespec *)((uVar21 >> 0x30) + (ulong)(0xffffffffffff < uVar18));
              uVar18 = uVar18 >> (0xffffffffffff < uVar18);
              ptVar27 = (timespec *)0xffffffffffffffff;
              if (__tp < (timespec *)0x10000) {
                if ((uVar18 & 0x1800000000000) != 0x800000000000) goto LAB_005493de;
                __tp = (timespec *)((long)__tp << 0x30 | uVar18);
                ptVar27 = __tp;
              }
              s->activity[iVar12] = (word)ptVar27;
              if ((timespec *)0x14c924d692ca61b < ptVar27) {
                act_var_rescale(s);
              }
              piVar16 = s->orderpos;
              uVar17 = piVar16[iVar12];
              uVar18 = (ulong)(int)uVar17;
              if (uVar18 != 0xffffffffffffffff) {
                piVar15 = (s->order).ptr;
                __tp = (timespec *)(ulong)(uint)piVar15[uVar18];
                if (uVar17 != 0) {
                  pwVar4 = s->activity;
                  uVar21 = pwVar4[piVar15[uVar18]];
                  do {
                    uVar23 = (uint)uVar18;
                    uVar29 = (int)((uVar23 - ((int)(uVar23 - 1) >> 0x1f)) + -1) >> 1;
                    iVar12 = piVar15[(int)uVar29];
                    uVar17 = uVar23;
                    if (uVar21 <= pwVar4[iVar12]) break;
                    piVar15[(int)uVar23] = iVar12;
                    piVar16[iVar12] = uVar23;
                    uVar18 = (ulong)uVar29;
                    uVar17 = uVar29;
                  } while (2 < uVar23);
                }
                goto LAB_00547bbc;
              }
            }
            else if (iVar11 == 1) {
              dVar7 = (double)s->var_inc * 3.0 + (double)s->activity[iVar12];
              s->activity[iVar12] = (word)dVar7;
              if (1e+100 < dVar7) {
                act_var_rescale(s);
              }
              piVar16 = s->orderpos;
              uVar17 = piVar16[iVar12];
              uVar18 = (ulong)(int)uVar17;
              if (uVar18 != 0xffffffffffffffff) {
                piVar15 = (s->order).ptr;
                __tp = (timespec *)(ulong)(uint)piVar15[uVar18];
                if (uVar17 != 0) {
                  pwVar4 = s->activity;
                  uVar21 = pwVar4[piVar15[uVar18]];
                  do {
                    uVar23 = (uint)uVar18;
                    uVar29 = (int)((uVar23 - ((int)(uVar23 - 1) >> 0x1f)) + -1) >> 1;
                    iVar12 = piVar15[(int)uVar29];
                    uVar17 = uVar23;
                    if (uVar21 <= pwVar4[iVar12]) break;
                    piVar15[(int)uVar23] = iVar12;
                    piVar16[iVar12] = uVar23;
                    uVar18 = (ulong)uVar29;
                    uVar17 = uVar29;
                  } while (2 < uVar23);
                }
                goto LAB_00547bbc;
              }
            }
            else {
              if (iVar11 != 0) {
                __assert_fail("0",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/bsat/satSolver.c"
                              ,0x176,"void act_var_bump_global(sat_solver *, int)");
              }
              wVar14 = ((long)((s->var_inc << 0x20) * 3) >> 0x20) + s->activity[iVar12];
              s->activity[iVar12] = wVar14;
              if ((int)wVar14 < 0) {
                act_var_rescale(s);
              }
              piVar16 = s->orderpos;
              uVar17 = piVar16[iVar12];
              uVar18 = (ulong)(int)uVar17;
              if (uVar18 != 0xffffffffffffffff) {
                piVar15 = (s->order).ptr;
                __tp = (timespec *)(ulong)(uint)piVar15[uVar18];
                if (uVar17 != 0) {
                  pwVar4 = s->activity;
                  uVar21 = pwVar4[piVar15[uVar18]];
                  do {
                    uVar23 = (uint)uVar18;
                    uVar29 = (int)((uVar23 - ((int)(uVar23 - 1) >> 0x1f)) + -1) >> 1;
                    iVar12 = piVar15[(int)uVar29];
                    uVar17 = uVar23;
                    if (uVar21 <= pwVar4[iVar12]) break;
                    piVar15[(int)uVar23] = iVar12;
                    piVar16[iVar12] = uVar23;
                    uVar18 = (ulong)uVar29;
                    uVar17 = uVar29;
                  } while (2 < uVar23);
                }
LAB_00547bbc:
                piVar15[(int)uVar17] = (int)__tp;
                piVar16[(int)__tp] = uVar17;
              }
            }
          }
          lVar19 = lVar19 + 1;
        } while (lVar19 < (s->act_vars).size);
      }
      local_60 = 0.019999999552965164;
      if (iVar10 != 0) {
        local_60 = 0.0;
      }
      local_40 = (long)(dVar33 * 100.0);
      local_94 = local_94 + 1;
      local_a0 = 4;
      uVar18 = 0;
      local_58 = 0;
      cVar9 = '\x04';
      do {
        uVar17 = sat_solver_propagate(s);
        if (uVar17 == 0) {
          if ((local_58 < local_40 || local_40 < 0) || s->fNoRestarts != 0) {
            if ((s->nRuntimeLimit != 0) && (((s->stats).conflicts & 0x3f) == 0)) {
              __tp = &local_80;
              iVar10 = clock_gettime(3,__tp);
              if (iVar10 < 0) {
                lVar19 = -1;
              }
              else {
                lVar19 = local_80.tv_nsec / 1000 + local_80.tv_sec * 1000000;
              }
              if (s->nRuntimeLimit < lVar19) goto LAB_00548e45;
            }
            if (((s->nConfLimit != 0) && (s->nConfLimit < (s->stats).conflicts)) ||
               ((s->nInsLimit != 0 && (s->nInsLimit < (s->stats).propagations)))) goto LAB_00548e45;
            if (((s->trail_lim).size == 0) && (s->fSkipSimplify == 0)) {
              sat_solver_simplify(s);
            }
            if ((s->nLearntMax != 0) && (s->nLearntMax <= (s->act_clas).size)) {
              sat_solver_reducedb(s);
            }
            pAVar1 = &(s->stats).decisions;
            *pAVar1 = *pAVar1 + 1;
            piVar16 = s->orderpos;
            dVar33 = s->random_seed * 1389796.0;
            puVar20 = (uint *)(s->order).ptr;
            dVar33 = dVar33 - (double)(int)(dVar33 / 2147483647.0) * 2147483647.0;
            s->random_seed = dVar33;
            if (local_60 <= dVar33 / 2147483647.0) goto LAB_00548fa9;
            dVar33 = dVar33 * 1389796.0 -
                     (double)(int)((dVar33 * 1389796.0) / 2147483647.0) * 2147483647.0;
            s->random_seed = dVar33;
            uVar17 = (uint)((double)s->size * (dVar33 / 2147483647.0));
            __tp = (timespec *)(ulong)uVar17;
            if (((int)uVar17 < 0) || (s->size <= (int)uVar17)) {
              __assert_fail("next >= 0 && next < s->size",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/bsat/satSolver.c"
                            ,0xb5,"int order_select(sat_solver *, float)");
            }
            bVar31 = s->assigns[uVar17] != '\x03';
            while (bVar31) {
LAB_00548fa9:
              iVar10 = (s->order).size;
              if ((long)iVar10 < 1) {
                uVar17 = 0xffffffff;
                break;
              }
              uVar17 = *puVar20;
              iVar12 = iVar10 + -1;
              uVar23 = puVar20[(long)iVar10 + -1];
              (s->order).size = iVar12;
              piVar16[(int)uVar17] = -1;
              if (iVar10 != 1) {
                iVar11 = 0;
                if (2 < iVar10) {
                  pwVar4 = s->activity;
                  uVar21 = pwVar4[(int)uVar23];
                  iVar10 = 1;
                  iVar11 = 0;
                  do {
                    iVar30 = iVar10 + 1;
                    iVar22 = iVar10;
                    if ((iVar30 < iVar12) &&
                       (iVar22 = iVar30,
                       pwVar4[(int)puVar20[iVar30]] <= pwVar4[(int)puVar20[iVar10]])) {
                      iVar22 = iVar10;
                    }
                    uVar29 = puVar20[iVar22];
                    if (pwVar4[(int)uVar29] <= uVar21) break;
                    puVar20[iVar11] = uVar29;
                    piVar16[(int)uVar29] = iVar11;
                    iVar10 = iVar22 * 2 + 1;
                    iVar11 = iVar22;
                  } while (iVar10 < iVar12);
                }
                puVar20[iVar11] = uVar23;
                piVar16[(int)uVar23] = iVar11;
              }
              bVar31 = s->assigns[(int)uVar17] != '\x03';
              __tp = (timespec *)((ulong)__tp & 0xffffffff);
              if (!bVar31) {
                __tp = (timespec *)(ulong)uVar17;
              }
              uVar17 = (uint)__tp;
            }
            if (uVar17 == 0xffffffff) {
              if (0 < s->size) {
                pcVar6 = s->assigns;
                piVar16 = s->model;
                lVar19 = 0;
                do {
                  piVar16[lVar19] = -(uint)(pcVar6[lVar19] != '\0') | 1;
                  lVar19 = lVar19 + 1;
                } while (lVar19 < s->size);
              }
              __tp = (timespec *)(ulong)(uint)s->root_level;
              sat_solver_canceluntil(s,s->root_level);
              cVar9 = '\x01';
              if (ptVar13 != (timespec *)0x0) {
                free(ptVar13);
                ptVar13 = (timespec *)0x0;
              }
              bVar31 = false;
            }
            else {
              uVar23 = uVar17 * 2;
              if (s->polarity[(int)uVar17] == '\0') {
                uVar23 = uVar23 | 1;
              }
              __tp = (timespec *)(ulong)uVar23;
              sat_solver_decision(s,uVar23);
              bVar31 = true;
            }
          }
          else {
LAB_00548e45:
            dVar33 = sat_solver_progress(s);
            s->progress_estimate = dVar33;
            __tp = (timespec *)(ulong)(uint)s->root_level;
            sat_solver_canceluntil(s,s->root_level);
            if (ptVar13 != (timespec *)0x0) {
              free(ptVar13);
              ptVar13 = (timespec *)0x0;
            }
            bVar31 = false;
            cVar9 = '\0';
          }
          if (bVar31) goto LAB_00548e88;
          bVar31 = false;
        }
        else {
          pAVar1 = &(s->stats).conflicts;
          *pAVar1 = *pAVar1 + 1;
          local_64 = (s->trail_lim).size;
          local_68 = s->root_level;
          if (local_64 == local_68) {
            __tp = (timespec *)(ulong)uVar17;
            sat_solver_analyze_final(s,uVar17,0);
            cVar9 = -1;
            if (ptVar13 != (timespec *)0x0) {
              free(ptVar13);
              ptVar13 = (timespec *)0x0;
            }
          }
          else {
            if ((int)uVar18 < 0) goto LAB_005493a0;
            plVar5 = s->trail;
            iVar10 = s->qtail;
            if ((int)local_a0 == 0) {
              if (ptVar13 == (timespec *)0x0) {
                ptVar13 = (timespec *)malloc(0);
              }
              else {
                ptVar13 = (timespec *)realloc(ptVar13,0);
              }
              local_a0 = 0;
              if (ptVar13 == (timespec *)0x0) {
                printf("Failed to realloc memory from %.1f MB to %.1f MB.\n",0,0);
                fflush(_stdout);
              }
            }
            iVar10 = iVar10 + -1;
            *(undefined4 *)&ptVar13->tv_sec = 0xfffffffe;
            uVar23 = 0xfffffffe;
            local_c4 = 1;
            iVar12 = 0;
            do {
              if (uVar17 == 0) {
                __assert_fail("h != 0",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/bsat/satSolver.c"
                              ,0x396,"void sat_solver_analyze(sat_solver *, int, veci *)");
              }
              if ((uVar17 & 1) == 0) {
                uVar29 = (s->Mem).uPageMask & uVar17;
                if (uVar29 == 0) {
LAB_00549362:
                  __assert_fail("k",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/bsat/satClause.h"
                                ,0x61,"clause *Sat_MemClause(Sat_Mem_t *, int, int)");
                }
                puVar20 = (uint *)((s->Mem).pPages[(int)uVar17 >> ((byte)(s->Mem).nPageSize & 0x1f)]
                                  + (int)uVar29);
                if ((*puVar20 & 1) != 0) {
                  piVar16 = (s->act_clas).ptr;
                  uVar17 = puVar20[(ulong)(*puVar20 >> 0xb) + 1];
                  if (s->ClaActType == 0) {
                    piVar15 = piVar16 + (int)uVar17;
                    *piVar15 = *piVar15 + s->cla_inc;
                    if (*piVar15 < 0) {
                      uVar17 = (s->act_clas).size;
                      if (s->ClaActType != 0) {
                        if (0 < (int)uVar17) {
                          uVar18 = 0;
                          do {
                            piVar16[uVar18] = (int)((float)piVar16[uVar18] * 1e-20);
                            uVar18 = uVar18 + 1;
                          } while (uVar17 != uVar18);
                        }
                        fVar32 = (float)s->cla_inc;
                        goto LAB_00547f55;
                      }
                      if (0 < (int)uVar17) {
                        lVar19 = 0;
                        do {
                          piVar16[lVar19] = (uint)piVar16[lVar19] >> 0xe;
                          lVar19 = lVar19 + 1;
                        } while (lVar19 < (s->act_clas).size);
                      }
                      uVar17 = s->cla_inc >> 0xe;
                      if (uVar17 < 0x401) {
                        uVar17 = 0x400;
                      }
                      goto LAB_00547f5a;
                    }
                  }
                  else {
                    fVar32 = (float)s->cla_inc;
                    fVar2 = (float)piVar16[(int)uVar17];
                    piVar16[(int)uVar17] = (int)(fVar2 + fVar32);
                    if (1e+20 < fVar2 + fVar32) {
                      lVar19 = (long)(s->act_clas).size;
                      if (0 < lVar19) {
                        lVar25 = 0;
                        do {
                          piVar16[lVar25] = (int)((float)piVar16[lVar25] * 1e-20);
                          lVar25 = lVar25 + 1;
                        } while (lVar19 != lVar25);
                      }
LAB_00547f55:
                      uVar17 = (uint)(long)(fVar32 * 1e-20);
LAB_00547f5a:
                      s->cla_inc = uVar17;
                    }
                  }
                }
                if ((uint)(uVar23 != 0xfffffffe) < *puVar20 >> 0xb) {
                  uVar18 = (ulong)(uVar23 != 0xfffffffe);
                  do {
                    iVar11 = (int)puVar20[uVar18 + 1] >> 1;
                    if ((s->tags[iVar11] == '\0') && (0 < s->levels[iVar11])) {
                      uVar17 = (s->tagged).cap;
                      if ((s->tagged).size == uVar17) {
                        iVar22 = (uVar17 >> 1) * 3;
                        if ((int)uVar17 < 4) {
                          iVar22 = uVar17 * 2;
                        }
                        piVar16 = (s->tagged).ptr;
                        if (piVar16 == (int *)0x0) {
                          piVar16 = (int *)malloc((long)iVar22 << 2);
                        }
                        else {
                          piVar16 = (int *)realloc(piVar16,(long)iVar22 << 2);
                        }
                        (s->tagged).ptr = piVar16;
                        if (piVar16 == (int *)0x0) {
                          printf("Failed to realloc memory from %.1f MB to %.1f MB.\n",
                                 SUB84((double)(s->tagged).cap * 9.5367431640625e-07,0),
                                 (double)iVar22 * 9.5367431640625e-07);
                          fflush(_stdout);
                        }
                        (s->tagged).cap = iVar22;
                      }
                      iVar22 = (s->tagged).size;
                      (s->tagged).size = iVar22 + 1;
                      (s->tagged).ptr[iVar22] = iVar11;
                      s->tags[iVar11] = '\x01';
                      act_var_bump(s,iVar11);
                      if (s->levels[iVar11] == (s->trail_lim).size) {
                        iVar12 = iVar12 + 1;
                      }
                      else {
                        uVar17 = puVar20[uVar18 + 1];
                        uVar23 = (uint)local_a0;
                        if (local_c4 == uVar23) {
                          uVar29 = (int)(local_a0 >> 1) * 3;
                          if ((int)uVar23 < 4) {
                            uVar29 = uVar23 * 2;
                          }
                          local_a0 = (ulong)uVar29;
                          if (ptVar13 == (timespec *)0x0) {
                            ptVar13 = (timespec *)malloc((long)(int)uVar29 << 2);
                          }
                          else {
                            ptVar13 = (timespec *)realloc(ptVar13,(long)(int)uVar29 << 2);
                          }
                          if (ptVar13 == (timespec *)0x0) {
                            printf("Failed to realloc memory from %.1f MB to %.1f MB.\n",
                                   SUB84((double)(int)uVar23 * 9.5367431640625e-07,0),
                                   (double)(int)uVar29 * 9.5367431640625e-07);
                            fflush(_stdout);
                          }
                        }
                        lVar19 = (long)(int)local_c4;
                        local_c4 = local_c4 + 1;
                        *(uint *)((long)&ptVar13->tv_sec + lVar19 * 4) = uVar17;
                      }
                    }
                    uVar18 = uVar18 + 1;
                  } while (uVar18 < *puVar20 >> 0xb);
                }
              }
              else {
                iVar11 = (int)uVar17 >> 2;
                if ((s->tags[iVar11] == '\0') && (0 < s->levels[iVar11])) {
                  uVar23 = (s->tagged).cap;
                  if ((s->tagged).size == uVar23) {
                    iVar22 = (uVar23 >> 1) * 3;
                    if ((int)uVar23 < 4) {
                      iVar22 = uVar23 * 2;
                    }
                    piVar16 = (s->tagged).ptr;
                    if (piVar16 == (int *)0x0) {
                      piVar16 = (int *)malloc((long)iVar22 << 2);
                    }
                    else {
                      piVar16 = (int *)realloc(piVar16,(long)iVar22 << 2);
                    }
                    (s->tagged).ptr = piVar16;
                    if (piVar16 == (int *)0x0) {
                      printf("Failed to realloc memory from %.1f MB to %.1f MB.\n",
                             SUB84((double)(s->tagged).cap * 9.5367431640625e-07,0),
                             (double)iVar22 * 9.5367431640625e-07);
                      fflush(_stdout);
                    }
                    (s->tagged).cap = iVar22;
                  }
                  iVar22 = (s->tagged).size;
                  (s->tagged).size = iVar22 + 1;
                  (s->tagged).ptr[iVar22] = iVar11;
                  s->tags[iVar11] = '\x01';
                  act_var_bump(s,iVar11);
                  if (s->levels[iVar11] == (s->trail_lim).size) {
                    iVar12 = iVar12 + 1;
                  }
                  else {
                    uVar23 = (uint)local_a0;
                    if (local_c4 == uVar23) {
                      uVar29 = (int)(local_a0 >> 1) * 3;
                      if ((int)uVar23 < 4) {
                        uVar29 = uVar23 * 2;
                      }
                      local_a0 = (ulong)uVar29;
                      if (ptVar13 == (timespec *)0x0) {
                        ptVar13 = (timespec *)malloc((long)(int)uVar29 << 2);
                      }
                      else {
                        ptVar13 = (timespec *)realloc(ptVar13,(long)(int)uVar29 << 2);
                      }
                      if (ptVar13 == (timespec *)0x0) {
                        printf("Failed to realloc memory from %.1f MB to %.1f MB.\n",
                               SUB84((double)(int)uVar23 * 9.5367431640625e-07,0),
                               (double)(int)uVar29 * 9.5367431640625e-07);
                        fflush(_stdout);
                      }
                    }
                    lVar19 = (long)(int)local_c4;
                    local_c4 = local_c4 + 1;
                    *(int *)((long)&ptVar13->tv_sec + lVar19 * 4) = (int)uVar17 >> 1;
                  }
                }
              }
              puVar20 = (uint *)(plVar5 + iVar10);
              do {
                uVar23 = *puVar20;
                puVar20 = puVar20 + -1;
                iVar10 = iVar10 + -1;
              } while (s->tags[(int)uVar23 >> 1] == '\0');
              uVar17 = s->reasons[(int)uVar23 >> 1];
              bVar31 = 1 < iVar12;
              iVar12 = iVar12 + -1;
            } while (bVar31);
            *(uint *)&ptVar13->tv_sec = uVar23 ^ 1;
            uVar17 = 0;
            if (1 < (int)local_c4) {
              uVar17 = 0;
              uVar18 = 1;
              do {
                uVar17 = uVar17 | 1 << (*(byte *)(s->levels +
                                                 (*(int *)((long)&ptVar13->tv_sec + uVar18 * 4) >> 1
                                                 )) & 0x1f);
                uVar18 = uVar18 + 1;
              } while (local_c4 != uVar18);
            }
            uVar18 = 1;
            if (1 < (int)local_c4) {
              local_38 = (ulong)local_c4;
              uVar18 = 1;
              uVar21 = 1;
              do {
                iVar10 = *(int *)((long)&ptVar13->tv_sec + uVar21 * 4) >> 1;
                if (s->reasons[iVar10] == 0) {
LAB_005489b9:
                  *(undefined4 *)((long)&ptVar13->tv_sec + (long)(int)uVar18 * 4) =
                       *(undefined4 *)((long)&ptVar13->tv_sec + uVar21 * 4);
                  uVar18 = (ulong)((int)uVar18 + 1);
                }
                else {
                  if ((s->stack).size < 0) goto LAB_005493a0;
                  iVar12 = (s->tagged).size;
                  (s->stack).size = 0;
                  if ((s->stack).cap == 0) {
                    piVar16 = (s->stack).ptr;
                    if (piVar16 == (int *)0x0) {
                      piVar16 = (int *)malloc(0);
                    }
                    else {
                      piVar16 = (int *)realloc(piVar16,0);
                    }
                    (s->stack).ptr = piVar16;
                    if (piVar16 == (int *)0x0) {
                      printf("Failed to realloc memory from %.1f MB to %.1f MB.\n",
                             SUB84((double)(s->stack).cap * 9.5367431640625e-07,0),0);
                      fflush(_stdout);
                    }
                    (s->stack).cap = 0;
                  }
                  iVar11 = (s->stack).size;
                  (s->stack).size = iVar11 + 1;
                  (s->stack).ptr[iVar11] = iVar10;
                  iVar10 = (s->stack).size;
                  if (iVar10 != 0) {
                    local_50 = (long)iVar12;
                    local_70 = uVar18;
                    do {
                      piVar16 = s->reasons;
                      piVar15 = (s->stack).ptr;
                      (s->stack).size = iVar10 - 1U;
                      uVar23 = piVar16[piVar15[(long)iVar10 + -1]];
                      if (uVar23 == 0) {
                        __assert_fail("s->reasons[v] != 0",
                                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/bsat/satSolver.c"
                                      ,0x309,"int sat_solver_lit_removable(sat_solver *, int, int)")
                        ;
                      }
                      if ((uVar23 & 1) != 0) {
                        iVar11 = (int)uVar23 >> 2;
                        if ((s->tags[iVar11] != '\0') || (s->levels[iVar11] == 0))
                        goto LAB_0054893b;
                        if ((piVar16[iVar11] != 0) &&
                           ((uVar17 >> (s->levels[iVar11] & 0x1fU) & 1) != 0)) {
                          uVar23 = (s->stack).cap;
                          if (iVar10 - 1U == uVar23) {
                            iVar10 = (uVar23 >> 1) * 3;
                            if ((int)uVar23 < 4) {
                              iVar10 = uVar23 * 2;
                            }
                            if (piVar15 == (int *)0x0) {
                              piVar16 = (int *)malloc((long)iVar10 << 2);
                            }
                            else {
                              piVar16 = (int *)realloc(piVar15,(long)iVar10 << 2);
                            }
                            (s->stack).ptr = piVar16;
                            if (piVar16 == (int *)0x0) {
                              printf("Failed to realloc memory from %.1f MB to %.1f MB.\n",
                                     SUB84((double)(s->stack).cap * 9.5367431640625e-07,0),
                                     (double)iVar10 * 9.5367431640625e-07);
                              fflush(_stdout);
                            }
                            (s->stack).cap = iVar10;
                          }
                          iVar10 = (s->stack).size;
                          (s->stack).size = iVar10 + 1;
                          (s->stack).ptr[iVar10] = iVar11;
                          if (s->tags[iVar11] == '\0') {
                            uVar23 = (s->tagged).cap;
                            if ((s->tagged).size == uVar23) {
                              iVar10 = (uVar23 >> 1) * 3;
                              if ((int)uVar23 < 4) {
                                iVar10 = uVar23 * 2;
                              }
                              piVar16 = (s->tagged).ptr;
                              if (piVar16 == (int *)0x0) {
                                piVar16 = (int *)malloc((long)iVar10 << 2);
                              }
                              else {
                                piVar16 = (int *)realloc(piVar16,(long)iVar10 << 2);
                              }
                              (s->tagged).ptr = piVar16;
                              if (piVar16 == (int *)0x0) {
                                printf("Failed to realloc memory from %.1f MB to %.1f MB.\n",
                                       SUB84((double)(s->tagged).cap * 9.5367431640625e-07,0),
                                       (double)iVar10 * 9.5367431640625e-07);
                                fflush(_stdout);
                              }
                              (s->tagged).cap = iVar10;
                            }
                            iVar10 = (s->tagged).size;
                            (s->tagged).size = iVar10 + 1;
                            (s->tagged).ptr[iVar10] = iVar11;
                          }
                          s->tags[iVar11] = '\x01';
                          goto LAB_0054893b;
                        }
                        iVar10 = (s->tagged).size;
                        if (iVar12 < iVar10) {
                          piVar16 = (s->tagged).ptr;
                          lVar19 = local_50;
                          do {
                            s->tags[piVar16[lVar19]] = '\0';
                            lVar19 = lVar19 + 1;
                            iVar10 = (s->tagged).size;
                          } while (lVar19 < iVar10);
                        }
LAB_0054899f:
                        if (iVar10 < iVar12) goto LAB_005493a0;
                        (s->tagged).size = iVar12;
                        uVar18 = local_70;
                        goto LAB_005489b9;
                      }
                      uVar29 = (s->Mem).uPageMask & uVar23;
                      if (uVar29 == 0) goto LAB_00549362;
                      piVar16 = (s->Mem).pPages[(int)uVar23 >> ((byte)(s->Mem).nPageSize & 0x1f)];
                      if (0xfff < (uint)piVar16[(int)uVar29]) {
                        uVar18 = 1;
                        do {
                          iVar10 = piVar16[(long)(int)uVar29 + uVar18 + 1] >> 1;
                          if ((s->tags[iVar10] == '\0') && (s->levels[iVar10] != 0)) {
                            if ((s->reasons[iVar10] == 0) ||
                               ((uVar17 >> (s->levels[iVar10] & 0x1fU) & 1) == 0)) {
                              iVar10 = (s->tagged).size;
                              if (iVar12 < iVar10) {
                                piVar16 = (s->tagged).ptr;
                                lVar19 = local_50;
                                do {
                                  s->tags[piVar16[lVar19]] = '\0';
                                  lVar19 = lVar19 + 1;
                                  iVar10 = (s->tagged).size;
                                } while (lVar19 < iVar10);
                              }
                              goto LAB_0054899f;
                            }
                            uVar23 = (s->stack).cap;
                            if ((s->stack).size == uVar23) {
                              iVar11 = (uVar23 >> 1) * 3;
                              if ((int)uVar23 < 4) {
                                iVar11 = uVar23 * 2;
                              }
                              piVar15 = (s->stack).ptr;
                              if (piVar15 == (int *)0x0) {
                                piVar15 = (int *)malloc((long)iVar11 << 2);
                              }
                              else {
                                piVar15 = (int *)realloc(piVar15,(long)iVar11 << 2);
                              }
                              (s->stack).ptr = piVar15;
                              if (piVar15 == (int *)0x0) {
                                printf("Failed to realloc memory from %.1f MB to %.1f MB.\n",
                                       SUB84((double)(s->stack).cap * 9.5367431640625e-07,0),
                                       (double)iVar11 * 9.5367431640625e-07);
                                fflush(_stdout);
                              }
                              (s->stack).cap = iVar11;
                            }
                            iVar11 = (s->stack).size;
                            (s->stack).size = iVar11 + 1;
                            (s->stack).ptr[iVar11] = iVar10;
                            if (s->tags[iVar10] == '\0') {
                              uVar23 = (s->tagged).cap;
                              if ((s->tagged).size == uVar23) {
                                iVar11 = (uVar23 >> 1) * 3;
                                if ((int)uVar23 < 4) {
                                  iVar11 = uVar23 * 2;
                                }
                                piVar15 = (s->tagged).ptr;
                                if (piVar15 == (int *)0x0) {
                                  piVar15 = (int *)malloc((long)iVar11 << 2);
                                }
                                else {
                                  piVar15 = (int *)realloc(piVar15,(long)iVar11 << 2);
                                }
                                (s->tagged).ptr = piVar15;
                                if (piVar15 == (int *)0x0) {
                                  printf("Failed to realloc memory from %.1f MB to %.1f MB.\n",
                                         SUB84((double)(s->tagged).cap * 9.5367431640625e-07,0),
                                         (double)iVar11 * 9.5367431640625e-07);
                                  fflush(_stdout);
                                }
                                (s->tagged).cap = iVar11;
                              }
                              iVar11 = (s->tagged).size;
                              (s->tagged).size = iVar11 + 1;
                              (s->tagged).ptr[iVar11] = iVar10;
                            }
                            s->tags[iVar10] = '\x01';
                          }
                          uVar18 = uVar18 + 1;
                        } while (uVar18 < (uint)piVar16[(int)uVar29] >> 0xb);
                      }
LAB_0054893b:
                      iVar10 = (s->stack).size;
                      uVar18 = local_70;
                    } while (iVar10 != 0);
                  }
                }
                uVar21 = uVar21 + 1;
              } while (uVar21 != local_38);
            }
            iVar10 = (int)uVar18;
            if ((int)local_c4 < iVar10) goto LAB_005493a0;
            pAVar1 = &(s->stats).tot_literals;
            *pAVar1 = *pAVar1 + (long)iVar10;
            iVar12 = (s->tagged).size;
            if (0 < iVar12) {
              piVar16 = (s->tagged).ptr;
              lVar19 = 0;
              do {
                s->tags[piVar16[lVar19]] = '\0';
                lVar19 = lVar19 + 1;
                iVar12 = (s->tagged).size;
              } while (lVar19 < iVar12);
            }
            if (iVar12 < 0) goto LAB_005493a0;
            (s->tagged).size = 0;
            piVar16 = local_48;
            if (1 < iVar10) {
              iVar12 = *(int *)((long)&ptVar13->tv_sec + 4);
              piVar16 = s->levels;
              lVar19 = 1;
              if (iVar10 != 2) {
                iVar11 = piVar16[iVar12 >> 1];
                uVar21 = 1;
                uVar28 = 2;
                do {
                  if (iVar11 < piVar16[*(int *)((long)&ptVar13->tv_sec + uVar28 * 4) >> 1]) {
                    uVar21 = uVar28 & 0xffffffff;
                    iVar11 = piVar16[*(int *)((long)&ptVar13->tv_sec + uVar28 * 4) >> 1];
                  }
                  uVar28 = uVar28 + 1;
                } while ((uVar18 & 0xffffffff) != uVar28);
                lVar19 = (long)(int)uVar21;
              }
              *(undefined4 *)((long)&ptVar13->tv_sec + 4) =
                   *(undefined4 *)((long)&ptVar13->tv_sec + lVar19 * 4);
              *(int *)((long)&ptVar13->tv_sec + lVar19 * 4) = iVar12;
              piVar16 = piVar16 + (*(int *)((long)&ptVar13->tv_sec + 4) >> 1);
            }
            iVar12 = *piVar16;
            if (*piVar16 < s->root_level) {
              iVar12 = s->root_level;
            }
            sat_solver_canceluntil(s,iVar12);
            iVar12 = 0;
            plVar5 = (lit *)((long)&ptVar13->tv_sec + (long)iVar10 * 4);
            if (1 < iVar10) {
              iVar12 = sat_solver_clause_new(s,(lit *)ptVar13,plVar5,1);
            }
            iVar11 = (int)ptVar13->tv_sec;
            lVar19 = (long)(iVar11 >> 1);
            if (s->pFreqs[lVar19] == '\0') {
              s->pFreqs[lVar19] = '\x01';
            }
            __tp = (timespec *)s->assigns;
            if (*(char *)((long)&__tp->tv_sec + lVar19) == '\x03') {
              *(byte *)((long)&__tp->tv_sec + lVar19) = (byte)iVar11 & 1;
              s->levels[lVar19] = (s->trail_lim).size;
              s->reasons[lVar19] = iVar12;
              __tp = (timespec *)(long)s->qtail;
              s->qtail = s->qtail + 1;
              s->trail[(long)__tp] = iVar11;
            }
            if (iVar10 < 1) {
              __assert_fail("veci_size(cls) > 0",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/bsat/satSolver.c"
                            ,0x2d0,"void sat_solver_record(sat_solver *, veci *)");
            }
            if (iVar12 == 0) {
              _Var8 = ptVar13->tv_sec;
              uVar17 = (s->unit_lits).cap;
              if ((s->unit_lits).size == uVar17) {
                iVar12 = (uVar17 >> 1) * 3;
                if ((int)uVar17 < 4) {
                  iVar12 = uVar17 * 2;
                }
                piVar16 = (s->unit_lits).ptr;
                __tp = (timespec *)((long)iVar12 << 2);
                if (piVar16 == (int *)0x0) {
                  piVar16 = (int *)malloc((size_t)__tp);
                }
                else {
                  piVar16 = (int *)realloc(piVar16,(size_t)__tp);
                }
                (s->unit_lits).ptr = piVar16;
                if (piVar16 == (int *)0x0) {
                  printf("Failed to realloc memory from %.1f MB to %.1f MB.\n",
                         SUB84((double)(s->unit_lits).cap * 9.5367431640625e-07,0),
                         (double)iVar12 * 9.5367431640625e-07);
                  fflush(_stdout);
                }
                (s->unit_lits).cap = iVar12;
              }
              iVar12 = (s->unit_lits).size;
              (s->unit_lits).size = iVar12 + 1;
              (s->unit_lits).ptr[iVar12] = (int)_Var8;
            }
            if (((Sto_Man_t *)s->pStore != (Sto_Man_t *)0x0) &&
               (__tp = ptVar13,
               iVar12 = Sto_ManAddClause((Sto_Man_t *)s->pStore,(lit *)ptVar13,plVar5), iVar12 == 0)
               ) {
              __assert_fail("RetValue",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/bsat/satSolver.c"
                            ,0x2d9,"void sat_solver_record(sat_solver *, veci *)");
            }
            if (iVar10 == 1) {
              s->levels[(int)ptVar13->tv_sec >> 1] = 0;
            }
            iVar10 = s->VarActType;
            if (iVar10 == 2) {
              uVar21 = s->var_inc;
              uVar28 = s->var_decay;
              uVar24 = uVar28;
              if (uVar21 >= uVar28 && uVar21 != uVar28) {
                uVar24 = uVar21;
              }
              if (uVar21 < uVar28) {
                uVar28 = uVar21;
              }
              uVar21 = uVar24 >> 0x20 & 0xffff;
              uVar26 = uVar28 >> 0x20 & 0xffff;
              uVar21 = (uVar21 * (uVar28 & 0xffffffff) >> 0xf) +
                       (uVar26 * (uVar24 & 0xffffffff) >> 0xf) +
                       ((uVar24 & 0xffffffff) * (uVar28 & 0xffffffff) >> 0x2f |
                       uVar21 * uVar26 * 0x20000);
              __tp = (timespec *)0xffffffffffff;
              uVar26 = uVar21 >> (0xffffffffffff < uVar21);
              uVar21 = (ulong)(0xffffffffffff < uVar21) + (uVar28 >> 0x30) + (uVar24 >> 0x30);
              uVar28 = 0xffffffffffffffff;
              if (uVar21 < 0x10000) {
                __tp = (timespec *)0x0;
                if ((uVar26 & 0xffff800000000000) != 0x800000000000) {
LAB_005493de:
                  __assert_fail("!(Exp>>16) && (Mnt>>47)==(word)1",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/util/utilDouble.h"
                                ,0x36,"xdbl Xdbl_Create(word, word)");
                }
                uVar28 = uVar21 << 0x30 | uVar26;
              }
              s->var_inc = uVar28;
            }
            else if (iVar10 == 1) {
              s->var_inc = (word)((double)s->var_inc * (double)s->var_decay);
            }
            else {
              if (iVar10 != 0) {
                __assert_fail("0",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/bsat/satSolver.c"
                              ,0x1a0,"void act_var_decay(sat_solver *)");
              }
              s->var_inc = (s->var_inc >> 4) + s->var_inc;
            }
            if (s->ClaActType == 0) {
              s->cla_inc = (s->cla_inc >> 10) + s->cla_inc;
            }
            else {
              s->cla_inc = s->cla_inc * s->cla_decay;
            }
          }
          local_58 = local_58 + 1;
          if (local_64 == local_68) {
            bVar31 = false;
          }
          else {
LAB_00548e88:
            bVar31 = true;
          }
        }
      } while (bVar31);
      if (((s->nConfLimit != 0) && (s->nConfLimit < (s->stats).conflicts)) ||
         ((s->nInsLimit != 0 && (s->nInsLimit < (s->stats).propagations)))) goto LAB_005491c3;
      if (s->nRuntimeLimit != 0) {
        iVar10 = clock_gettime(3,&local_80);
        if (iVar10 < 0) {
          lVar19 = -1;
        }
        else {
          lVar19 = local_80.tv_nsec / 1000 + local_80.tv_sec * 1000000;
        }
        if (s->nRuntimeLimit < lVar19) goto LAB_005491c3;
      }
      if ((s->pFuncStop != (_func_int_int *)0x0) &&
         (iVar10 = (*s->pFuncStop)(s->RunId), iVar10 != 0)) goto LAB_005491c3;
      bVar31 = true;
    }
    else {
      iVar10 = clock_gettime(3,&local_80);
      if (iVar10 < 0) {
        lVar19 = -1;
      }
      else {
        lVar19 = local_80.tv_nsec / 1000 + local_80.tv_sec * 1000000;
      }
      if (lVar19 <= s->nRuntimeLimit) goto LAB_0054731c;
LAB_005491c3:
      bVar31 = false;
    }
  } while (bVar31);
  if (0 < s->verbosity) {
    puts("==============================================================================");
  }
  sat_solver_canceluntil(s,s->root_level);
  if (((cVar9 == '\x01') && ((s->user_vars).size != 0)) && (0 < (s->user_vars).size)) {
    lVar19 = 0;
    do {
      iVar10 = (s->user_vars).ptr[lVar19];
      if (((long)iVar10 < 0) || (s->size <= iVar10)) {
        __assert_fail("v >= 0 && v < s->size",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/bsat/satSolver.h"
                      ,0xda,"int sat_solver_var_value(sat_solver *, int)");
      }
      iVar10 = s->model[iVar10];
      uVar17 = (s->user_values).cap;
      if ((s->user_values).size == uVar17) {
        iVar12 = (uVar17 >> 1) * 3;
        if ((int)uVar17 < 4) {
          iVar12 = uVar17 * 2;
        }
        piVar16 = (s->user_values).ptr;
        if (piVar16 == (int *)0x0) {
          piVar16 = (int *)malloc((long)iVar12 << 2);
        }
        else {
          piVar16 = (int *)realloc(piVar16,(long)iVar12 << 2);
        }
        (s->user_values).ptr = piVar16;
        if (piVar16 == (int *)0x0) {
          printf("Failed to realloc memory from %.1f MB to %.1f MB.\n",
                 SUB84((double)(s->user_values).cap * 9.5367431640625e-07,0),
                 (double)iVar12 * 9.5367431640625e-07);
          fflush(_stdout);
        }
        (s->user_values).cap = iVar12;
      }
      iVar12 = (s->user_values).size;
      (s->user_values).size = iVar12 + 1;
      (s->user_values).ptr[iVar12] = (uint)(iVar10 == 1);
      lVar19 = lVar19 + 1;
    } while (lVar19 < (s->user_vars).size);
  }
  return (int)cVar9;
}

Assistant:

int sat_solver_solve_internal(sat_solver* s)
{
    lbool status = l_Undef;
    int restart_iter = 0;
    veci_resize(&s->unit_lits, 0);
    s->nCalls++;

    if (s->verbosity >= 1){
        printf("==================================[MINISAT]===================================\n");
        printf("| Conflicts |     ORIGINAL     |              LEARNT              | Progress |\n");
        printf("|           | Clauses Literals |   Limit Clauses Literals  Lit/Cl |          |\n");
        printf("==============================================================================\n");
    }

    while (status == l_Undef){
        ABC_INT64_T nof_conflicts;
        double Ratio = (s->stats.learnts == 0)? 0.0 :
            s->stats.learnts_literals / (double)s->stats.learnts;
        if ( s->nRuntimeLimit && Abc_Clock() > s->nRuntimeLimit )
            break;
        if (s->verbosity >= 1)
        {
            printf("| %9.0f | %7.0f %8.0f | %7.0f %7.0f %8.0f %7.1f | %6.3f %% |\n", 
                (double)s->stats.conflicts,
                (double)s->stats.clauses, 
                (double)s->stats.clauses_literals,
                (double)0, 
                (double)s->stats.learnts, 
                (double)s->stats.learnts_literals,
                Ratio,
                s->progress_estimate*100);
            fflush(stdout);
        }
        nof_conflicts = (ABC_INT64_T)( 100 * luby(2, restart_iter++) );
        status = sat_solver_search(s, nof_conflicts);
        // quit the loop if reached an external limit
        if ( s->nConfLimit && s->stats.conflicts > s->nConfLimit )
            break;
        if ( s->nInsLimit  && s->stats.propagations > s->nInsLimit )
            break;
        if ( s->nRuntimeLimit && Abc_Clock() > s->nRuntimeLimit )
            break;
        if ( s->pFuncStop && s->pFuncStop(s->RunId) )
            break;
    }
    if (s->verbosity >= 1)
        printf("==============================================================================\n");

    sat_solver_canceluntil(s,s->root_level);
    // save variable values
    if ( status == l_True && s->user_vars.size )
    {
        int v;
        for ( v = 0; v < s->user_vars.size; v++ )
            veci_push(&s->user_values, sat_solver_var_value(s, s->user_vars.ptr[v]));
    }
    return status;
}